

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.h
# Opt level: O0

bool pbrt::
     ParseArg<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string*>
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *iter,__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      end,string *name,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *out,
               function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
               *onError)

{
  byte bVar1;
  byte bVar2;
  undefined1 uVar3;
  bool bVar4;
  reference pbVar5;
  string *prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_RDI;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_R8;
  string value;
  string arg;
  undefined4 in_stack_fffffffffffffe18;
  undefined1 in_stack_fffffffffffffe1c;
  undefined1 in_stack_fffffffffffffe1d;
  undefined1 in_stack_fffffffffffffe1e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  char *in_stack_fffffffffffffe48;
  string *in_stack_fffffffffffffe58;
  string local_188 [32];
  string local_168 [36];
  undefined4 local_144;
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_18;
  byte local_1;
  
  local_28 = in_RCX;
  local_18 = in_RDI;
  pbVar5 = __gnu_cxx::
           __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(in_RDI);
  __args = &local_50;
  std::__cxx11::string::string((string *)__args,(string *)pbVar5);
  prefix = (string *)std::__cxx11::string::operator[]((ulong)__args);
  if (prefix->_M_dataplus == (_Alloc_hider)0x2d) {
    std::__cxx11::string::substr((ulong)local_80,(ulong)&local_50);
    std::__cxx11::string::operator=((string *)&local_50,local_80);
    std::__cxx11::string::~string(local_80);
  }
  else {
    std::__cxx11::string::substr((ulong)local_a0,(ulong)&local_50);
    std::__cxx11::string::operator=((string *)&local_50,local_a0);
    std::__cxx11::string::~string(local_a0);
  }
  normalizeArg(in_stack_fffffffffffffe58);
  std::operator+(in_stack_fffffffffffffe38,(char)((ulong)prefix >> 0x38));
  normalizeArg(in_stack_fffffffffffffe58);
  bVar1 = matchPrefix(in_stack_fffffffffffffe38,prefix);
  std::__cxx11::string::~string(local_e0);
  std::__cxx11::string::~string(local_100);
  std::__cxx11::string::~string(local_c0);
  if ((bVar1 & 1) == 0) {
    normalizeArg(in_stack_fffffffffffffe58);
    normalizeArg(in_stack_fffffffffffffe58);
    bVar2 = std::operator==(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    std::__cxx11::string::~string(local_188);
    std::__cxx11::string::~string(local_168);
    if ((bVar2 & 1) == 0) {
      local_1 = 0;
      local_144 = 1;
    }
    else {
      uVar3 = enable<std::__cxx11::string*>(local_28);
      if ((bool)uVar3) {
        local_1 = 1;
        local_144 = 1;
      }
      else {
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(local_18);
        bVar4 = __gnu_cxx::operator==
                          (in_R8,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)CONCAT17(bVar1,CONCAT16(in_stack_fffffffffffffe1e,
                                                            CONCAT15(bVar2,CONCAT14(uVar3,
                                                  in_stack_fffffffffffffe18)))));
        if (bVar4) {
          StringPrintf<std::__cxx11::string&>(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
          std::
          function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
          ::operator()((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                        *)prefix,__args);
          std::__cxx11::string::~string((string *)&stack0xfffffffffffffe58);
          local_1 = 0;
          local_144 = 1;
        }
        else {
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator*(local_18);
          bVar4 = initArg((string *)
                          CONCAT17(bVar1,CONCAT16(in_stack_fffffffffffffe1e,
                                                  CONCAT15(bVar2,CONCAT14(uVar3,
                                                  in_stack_fffffffffffffe18)))),(string *)0x44081d);
          if (bVar4) {
            local_1 = 1;
            local_144 = 1;
          }
          else {
            __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator*(local_18);
            StringPrintf<std::__cxx11::string&,std::__cxx11::string_const&>
                      (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,in_stack_fffffffffffffe38
                      );
            std::
            function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
            ::operator()((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                          *)prefix,__args);
            std::__cxx11::string::~string((string *)&stack0xfffffffffffffe38);
            local_1 = 0;
            local_144 = 1;
          }
        }
      }
    }
  }
  else {
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_120,(ulong)&local_50);
    local_1 = initArg((string *)
                      CONCAT17(bVar1,CONCAT16(in_stack_fffffffffffffe1e,
                                              CONCAT15(in_stack_fffffffffffffe1d,
                                                       CONCAT14(in_stack_fffffffffffffe1c,
                                                                in_stack_fffffffffffffe18)))),
                      (string *)0x44057b);
    if (!(bool)local_1) {
      StringPrintf<std::__cxx11::string&,std::__cxx11::string_const&>
                (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
      std::
      function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
      ::operator()((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                    *)prefix,__args);
      std::__cxx11::string::~string(local_140);
    }
    local_144 = 1;
    std::__cxx11::string::~string(local_120);
  }
  std::__cxx11::string::~string((string *)&local_50);
  return (bool)(local_1 & 1);
}

Assistant:

bool ParseArg(Iter *iter, Iter end, const std::string &name, T out,
              std::function<void(std::string)> onError) {
    std::string arg = **iter;

    // Strip either one or two leading dashes.
    if (arg[1] == '-')
        arg = arg.substr(2);
    else
        arg = arg.substr(1);

    if (matchPrefix(normalizeArg(arg), normalizeArg(name + '='))) {
        // --arg=value
        std::string value = arg.substr(name.size() + 1);
        if (!initArg(value, out)) {
            onError(StringPrintf("invalid value \"%s\" for --%s argument", value, name));
            return false;
        }
        return true;
    } else if (normalizeArg(arg) == normalizeArg(name)) {
        // --arg <value>, except for bool arguments, which are set to true
        // without expecting another argument.
        if (enable(out))
            return true;

        ++(*iter);
        if (*iter == end) {
            onError(StringPrintf("missing value after --%s argument", arg));
            return false;
        }
        if (!initArg(**iter, out)) {
            onError(StringPrintf("invalid value \"%s\" for --%s argument", **iter, name));
            return false;
        }
        return true;
    } else
        return false;
}